

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O0

int __thiscall rcg::Interface::close(Interface *this,int __fd)

{
  int extraout_EAX;
  element_type *peVar1;
  element_type *this_00;
  int __fd_00;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff98;
  lock_guard<std::mutex> *in_stack_ffffffffffffffa0;
  shared_ptr<GenApi_3_4::CNodeMapRef> *this_01;
  undefined1 local_40 [16];
  shared_ptr<GenApi_3_4::CNodeMapRef> local_30 [2];
  Interface *local_8;
  
  local_8 = this;
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if ((0 < this->n_open) && (this->n_open = this->n_open + -1, this->n_open == 0)) {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x113406);
    (*peVar1->IFClose)(this->ifh);
    this->ifh = (void *)0x0;
    this_01 = local_30;
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr(this_01,in_stack_ffffffffffffff98);
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::operator=
              (this_01,(shared_ptr<GenApi_3_4::CNodeMapRef> *)in_stack_ffffffffffffff98);
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x113465);
    std::shared_ptr<rcg::CPort>::shared_ptr
              ((shared_ptr<rcg::CPort> *)this_01,in_stack_ffffffffffffff98);
    __fd_00 = (int)local_40;
    std::shared_ptr<rcg::CPort>::operator=
              ((shared_ptr<rcg::CPort> *)this_01,(shared_ptr<rcg::CPort> *)in_stack_ffffffffffffff98
              );
    std::shared_ptr<rcg::CPort>::~shared_ptr((shared_ptr<rcg::CPort> *)0x113499);
    this_00 = std::__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<rcg::System,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1134a7);
    System::close(this_00,__fd_00);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1134d9);
  return extraout_EAX;
}

Assistant:

void Interface::close()
{
  std::lock_guard<std::mutex> lock(mtx);

  if (n_open > 0)
  {
    n_open--;

    if (n_open == 0)
    {
      gentl->IFClose(ifh);
      ifh=0;

      nodemap=0;
      cport=0;

      parent->close();
    }
  }
}